

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cStencilTexturingTests.cpp
# Opt level: O2

GLuint __thiscall
gl4cts::StencilTexturing::FunctionalTest::prepareProgram
          (FunctionalTest *this,bool is_draw,bool is_stencil)

{
  undefined *puVar1;
  GLuint GVar2;
  long lVar3;
  undefined1 *puVar4;
  undefined **ppuVar5;
  undefined8 *puVar6;
  GLchar *text;
  undefined7 in_register_00000031;
  char *token;
  string *string;
  GLchar *pGVar7;
  GLchar *pGVar8;
  GLuint i;
  GLchar *shader_templates [5];
  GLchar *local_e8;
  size_t position;
  string shader_code [5];
  
  if ((int)CONCAT71(in_register_00000031,is_draw) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)shader_code,m_compute_shader_code,(allocator<char> *)shader_templates);
    puVar1 = m_sampler_definition_stencil;
    pGVar8 = m_sampler_definition_depth;
    ppuVar5 = &m_image_definition_depth;
    if (is_stencil) {
      ppuVar5 = &m_image_definition_stencil;
    }
    puVar6 = &m_output_type_depth;
    if (is_stencil) {
      puVar6 = &m_output_type_stencil;
    }
    shader_templates[0] = (GLchar *)0x0;
    pGVar7 = (GLchar *)*puVar6;
    Utils::replaceToken("IMAGE_DEFINITION",(size_t *)shader_templates,*ppuVar5,shader_code);
    if (is_stencil) {
      pGVar8 = puVar1;
    }
    Utils::replaceToken("SAMPLER_DEFINITION",(size_t *)shader_templates,pGVar8,shader_code);
    Utils::replaceToken("TYPE",(size_t *)shader_templates,pGVar7,shader_code);
    GVar2 = Utils::createAndBuildProgram
                      ((this->super_TestCase).m_context,shader_code[0]._M_dataplus._M_p,
                       (GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0);
    std::__cxx11::string::~string((string *)shader_code);
  }
  else {
    lVar3 = 0x10;
    do {
      puVar4 = (undefined1 *)((long)&shader_code[0]._M_dataplus._M_p + lVar3);
      *(undefined1 **)((long)&local_e8 + lVar3) = puVar4;
      *(undefined8 *)((long)shader_code + lVar3 + -8) = 0;
      *puVar4 = 0;
      lVar3 = lVar3 + 0x20;
    } while (lVar3 != 0xb0);
    shader_templates[0] = m_fragment_shader_code;
    shader_templates[1] = m_geometry_shader_code;
    shader_templates[2] = m_tesselation_control_shader_code;
    shader_templates[3] = m_tesselation_evaluation_shader_code;
    pGVar7 = m_sampler_definition_stencil;
    pGVar8 = m_expected_value_stencil;
    if (!is_stencil) {
      pGVar7 = m_sampler_definition_depth;
      pGVar8 = m_expected_value_depth;
    }
    puVar6 = &m_output_type_depth;
    if (is_stencil) {
      puVar6 = &m_output_type_stencil;
    }
    shader_templates[4] = m_vertex_shader_code;
    local_e8 = (GLchar *)*puVar6;
    string = shader_code;
    for (lVar3 = 0; lVar3 != 5; lVar3 = lVar3 + 1) {
      position = 0;
      std::__cxx11::string::assign((char *)string);
      if (lVar3 == 0) {
        Utils::replaceToken("TYPE",&position,local_e8,string);
        token = "SAMPLER_DEFINITION";
        text = pGVar7;
      }
      else {
        Utils::replaceToken("SAMPLER_DEFINITION",&position,pGVar7,string);
        token = "EXPECTED_VALUE";
        text = pGVar8;
      }
      Utils::replaceToken(token,&position,text,string);
      string = string + 1;
    }
    GVar2 = Utils::createAndBuildProgram
                      ((this->super_TestCase).m_context,(GLchar *)0x0,
                       shader_code[0]._M_dataplus._M_p,shader_code[1]._M_dataplus._M_p,
                       shader_code[2]._M_dataplus._M_p,shader_code[3]._M_dataplus._M_p,
                       shader_code[4]._M_dataplus._M_p);
    lVar3 = 0x80;
    do {
      std::__cxx11::string::~string((string *)((long)&shader_code[0]._M_dataplus._M_p + lVar3));
      lVar3 = lVar3 + -0x20;
    } while (lVar3 != -0x20);
  }
  return GVar2;
}

Assistant:

GLuint FunctionalTest::prepareProgram(bool is_draw, bool is_stencil)
{
	GLuint program_id = 0;

	if (true != is_draw)
	{
		std::string   cs_code			 = m_compute_shader_code;
		const GLchar* image_definition   = m_image_definition_stencil;
		size_t		  position			 = 0;
		const GLchar* sampler_definition = m_sampler_definition_stencil;
		const GLchar* type				 = m_output_type_stencil;

		if (false == is_stencil)
		{
			image_definition   = m_image_definition_depth;
			sampler_definition = m_sampler_definition_depth;
			type			   = m_output_type_depth;
		}

		Utils::replaceToken("IMAGE_DEFINITION", position, image_definition, cs_code);
		Utils::replaceToken("SAMPLER_DEFINITION", position, sampler_definition, cs_code);
		Utils::replaceToken("TYPE", position, type, cs_code);

		program_id = Utils::createAndBuildProgram(m_context, cs_code.c_str(), 0 /* fs_code */, 0 /* gs_code */,
												  0 /* tcs_code */, 0 /* tes_code */, 0 /* vs_code */);
	}
	else
	{
#define N_FUNCTIONAL_TEST_SHADER_STAGES 5

		const GLchar* expected_value	 = m_expected_value_stencil;
		const GLchar* sampler_definition = m_sampler_definition_stencil;
		std::string   shader_code[N_FUNCTIONAL_TEST_SHADER_STAGES];
		const GLchar* shader_templates[N_FUNCTIONAL_TEST_SHADER_STAGES] = {
			m_fragment_shader_code, m_geometry_shader_code, m_tesselation_control_shader_code,
			m_tesselation_evaluation_shader_code, m_vertex_shader_code
		};
		const GLchar* type = m_output_type_stencil;

		if (false == is_stencil)
		{
			expected_value	 = m_expected_value_depth;
			sampler_definition = m_sampler_definition_depth;
			type			   = m_output_type_depth;
		}

		for (GLuint i = 0; i < N_FUNCTIONAL_TEST_SHADER_STAGES; ++i)
		{
			size_t position = 0;

			shader_code[i] = shader_templates[i];

			if (0 == i)
			{
				Utils::replaceToken("TYPE", position, type, shader_code[i]);
				Utils::replaceToken("SAMPLER_DEFINITION", position, sampler_definition, shader_code[i]);
				//Utils::replaceToken("TYPE",               position, type,               shader_code[i]);
			}
			else
			{
				Utils::replaceToken("SAMPLER_DEFINITION", position, sampler_definition, shader_code[i]);
				Utils::replaceToken("EXPECTED_VALUE", position, expected_value, shader_code[i]);
			}
		}

		program_id =
			Utils::createAndBuildProgram(m_context, 0 /* cs_code */, shader_code[0].c_str() /* fs_code  */,
										 shader_code[1].c_str() /* gs_code  */, shader_code[2].c_str() /* tcs_code */,
										 shader_code[3].c_str() /* tes_code */, shader_code[4].c_str() /* vs_code  */);
	}

	/* Done */
	return program_id;
}